

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::Method::ByteSizeLong(Method *this)

{
  long lVar1;
  Rep *pRVar2;
  string *psVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  void **ppvVar7;
  
  sVar6 = (size_t)(this->options_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->options_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  lVar1 = sVar6 * 8;
  for (lVar5 = 0; lVar1 - lVar5 != 0; lVar5 = lVar5 + 8) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::Option>
                      (*(Option **)((long)ppvVar7 + lVar5));
    sVar6 = sVar6 + sVar4;
  }
  psVar3 = (this->name_).ptr_;
  if (psVar3->_M_string_length != 0) {
    sVar4 = internal::WireFormatLite::StringSize(psVar3);
    sVar6 = sVar6 + sVar4 + 1;
  }
  psVar3 = (this->request_type_url_).ptr_;
  if (psVar3->_M_string_length != 0) {
    sVar4 = internal::WireFormatLite::StringSize(psVar3);
    sVar6 = sVar6 + sVar4 + 1;
  }
  psVar3 = (this->response_type_url_).ptr_;
  if (psVar3->_M_string_length != 0) {
    sVar4 = internal::WireFormatLite::StringSize(psVar3);
    sVar6 = sVar6 + sVar4 + 1;
  }
  sVar4 = sVar6 + 2;
  if (this->request_streaming_ == false) {
    sVar4 = sVar6;
  }
  sVar6 = sVar4 + 2;
  if (this->response_streaming_ == false) {
    sVar6 = sVar4;
  }
  if (this->syntax_ != 0) {
    sVar4 = io::CodedOutputStream::VarintSize32SignExtended(this->syntax_);
    sVar6 = sVar6 + sVar4 + 1;
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar6;
    return sVar6;
  }
  sVar6 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar6,
                     &this->_cached_size_);
  return sVar6;
}

Assistant:

size_t Method::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.Method)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.Option options = 6;
  total_size += 1UL * this->_internal_options_size();
  for (const auto& msg : this->options_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string name = 1;
  if (this->name().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_name());
  }

  // string request_type_url = 2;
  if (this->request_type_url().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_request_type_url());
  }

  // string response_type_url = 4;
  if (this->response_type_url().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_response_type_url());
  }

  // bool request_streaming = 3;
  if (this->request_streaming() != 0) {
    total_size += 1 + 1;
  }

  // bool response_streaming = 5;
  if (this->response_streaming() != 0) {
    total_size += 1 + 1;
  }

  // .google.protobuf.Syntax syntax = 7;
  if (this->syntax() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_syntax());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}